

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.cpp
# Opt level: O1

void __thiscall qclab::io::QASMFile::parse(QASMFile *this)

{
  value_type *pvVar1;
  char cVar2;
  int iVar3;
  string *delimiter;
  long lVar4;
  char *pcVar5;
  value_type *str_00;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  char *local_100;
  ulong local_f8;
  char local_f0;
  undefined7 uStack_ef;
  string local_e0;
  QASMFile *local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  lVar4 = *(long *)this;
  if (((&this->field_0x20)[*(long *)(lVar4 + -0x18)] & 2) == 0) {
    local_58 = (string *)&this->qregName_;
    local_50 = &this->gateCommands_;
    bVar8 = false;
    local_c0 = this;
    do {
      local_100 = &local_f0;
      local_f8 = 0;
      local_f0 = '\0';
      cVar2 = std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)this);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)this,(string *)&local_100,cVar2);
      pcVar7 = local_100 + local_f8;
      pcVar6 = local_100;
      if (0 < (long)local_f8 >> 2) {
        pcVar6 = local_100 + (local_f8 & 0xfffffffffffffffc);
        lVar4 = ((long)local_f8 >> 2) + 1;
        pcVar5 = local_100 + 3;
        do {
          iVar3 = isspace((int)pcVar5[-3]);
          if (iVar3 != 0) {
            pcVar5 = pcVar5 + -3;
            goto LAB_001232d8;
          }
          iVar3 = isspace((int)pcVar5[-2]);
          if (iVar3 != 0) {
            pcVar5 = pcVar5 + -2;
            goto LAB_001232d8;
          }
          iVar3 = isspace((int)pcVar5[-1]);
          if (iVar3 != 0) {
            pcVar5 = pcVar5 + -1;
            goto LAB_001232d8;
          }
          iVar3 = isspace((int)*pcVar5);
          if (iVar3 != 0) goto LAB_001232d8;
          lVar4 = lVar4 + -1;
          pcVar5 = pcVar5 + 4;
        } while (1 < lVar4);
      }
      lVar4 = (long)pcVar7 - (long)pcVar6;
      if (lVar4 == 1) {
LAB_001232b0:
        iVar3 = isspace((int)*pcVar6);
        pcVar5 = pcVar6;
        if (iVar3 == 0) {
          pcVar5 = pcVar7;
        }
      }
      else if (lVar4 == 2) {
LAB_001232a0:
        iVar3 = isspace((int)*pcVar6);
        pcVar5 = pcVar6;
        if (iVar3 == 0) {
          pcVar6 = pcVar6 + 1;
          goto LAB_001232b0;
        }
      }
      else {
        pcVar5 = pcVar7;
        if ((lVar4 == 3) && (iVar3 = isspace((int)*pcVar6), pcVar5 = pcVar6, iVar3 == 0)) {
          pcVar6 = pcVar6 + 1;
          goto LAB_001232a0;
        }
      }
LAB_001232d8:
      pcVar6 = pcVar5 + 1;
      if (pcVar6 != pcVar7 && pcVar5 != pcVar7) {
        do {
          cVar2 = *pcVar6;
          iVar3 = isspace((int)cVar2);
          if (iVar3 == 0) {
            *pcVar5 = cVar2;
            pcVar5 = pcVar5 + 1;
          }
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != pcVar7);
      }
      local_f8 = (long)pcVar5 - (long)local_100;
      *pcVar5 = '\0';
      this = local_c0;
      if (local_f8 != 0) {
        delimiter = (string *)0x2;
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_100);
        this = local_c0;
        iVar3 = std::__cxx11::string::compare((char *)&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 != 0) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,";","");
          split<std::__cxx11::string>(&local_48,(io *)&local_100,&local_78,delimiter);
          str_00 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar1 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            str_00 = local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar1 = local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; str_00 != pvVar1; str_00 = str_00 + 1) {
            if (bVar8) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_50,str_00);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_e0,(ulong)str_00);
              iVar3 = std::__cxx11::string::compare((char *)&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar3 == 0) {
                std::__cxx11::string::substr((ulong)&local_e0,(ulong)str_00);
                std::__cxx11::string::operator=((string *)str_00,(string *)&local_e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"[","");
                left_of(&local_e0,str_00,&local_98);
                std::__cxx11::string::operator=(local_58,(string *)&local_e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p,
                                  local_98.field_2._M_allocated_capacity + 1);
                }
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"]","");
                left_of(&local_e0,str_00,&local_b8);
                iVar3 = read_value<int>(&local_e0);
                this->nbQubits_ = iVar3;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
                bVar8 = true;
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
      }
      lVar4 = *(long *)this;
    } while (((&this->field_0x20)[*(long *)(lVar4 + -0x18)] & 2) == 0);
  }
  return;
}

Assistant:

void QASMFile::parse() {

    bool hasQreg = false ;

    // loop over lines in file
    while ( not stream_.eof() ) {

      // new line + remove all whitespaces
      std::string str ;
      std::getline( stream_ , str ) ;
      str.erase( remove_if( str.begin() , str.end() , isspace ) , str.end() ) ;

      // skip blank and comment lines
      if ( str.length() < 1 ) { continue ; }
      if ( str.substr( 0 , 2 ) == "//" ) { continue ; }

      // split commands on this line
      auto commands = split< std::string >( str , ";" ) ;

      // parse commands
      for ( auto& command : commands ) {
        if ( !hasQreg ) {
          if ( command.substr( 0 , 4 ) == "qreg" ) {
            // set quantum register
            command = command.substr( 4 ) ;
            qregName_ = left_of( command , "[" ) ;
            nbQubits_ = read_value< int >( left_of( command , "]" ) ) ;
            hasQreg = true ;
          }
        } else {
          // read gates
          gateCommands_.push_back( command ) ;
        }
      }

    }

  }